

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ricecomp.c
# Opt level: O0

int output_nbits(Buffer *buffer,int bits,int n)

{
  Buffer_t *pBVar1;
  uint uVar2;
  int local_20;
  uint local_1c;
  int lbits_to_go;
  int lbitbuffer;
  int n_local;
  int bits_local;
  Buffer *buffer_local;
  
  local_1c = buffer->bitbuffer;
  local_20 = buffer->bits_to_go;
  lbits_to_go = n;
  if (0x20 < local_20 + n) {
    local_1c = bits >> ((char)n - (byte)local_20 & 0x1f) & output_nbits::mask[local_20] |
               local_1c << ((byte)local_20 & 0x1f);
    pBVar1 = buffer->current;
    buffer->current = pBVar1 + 1;
    *pBVar1 = (Buffer_t)local_1c;
    lbits_to_go = n - local_20;
    local_20 = 8;
  }
  uVar2 = bits & output_nbits::mask[lbits_to_go] | local_1c << ((byte)lbits_to_go & 0x1f);
  for (local_20 = local_20 - lbits_to_go; local_20 < 1; local_20 = local_20 + 8) {
    pBVar1 = buffer->current;
    buffer->current = pBVar1 + 1;
    *pBVar1 = (Buffer_t)((int)uVar2 >> (-(char)local_20 & 0x1fU));
  }
  buffer->bitbuffer = uVar2;
  buffer->bits_to_go = local_20;
  return 0;
}

Assistant:

static int output_nbits(Buffer *buffer, int bits, int n)
{
/* local copies */
int lbitbuffer;
int lbits_to_go;
    /* AND mask for the right-most n bits */
    static unsigned int mask[33] = 
         {0,
	  0x1,       0x3,       0x7,       0xf,       0x1f,       0x3f,       0x7f,       0xff,
	  0x1ff,     0x3ff,     0x7ff,     0xfff,     0x1fff,     0x3fff,     0x7fff,     0xffff,
	  0x1ffff,   0x3ffff,   0x7ffff,   0xfffff,   0x1fffff,   0x3fffff,   0x7fffff,   0xffffff,
	  0x1ffffff, 0x3ffffff, 0x7ffffff, 0xfffffff, 0x1fffffff, 0x3fffffff, 0x7fffffff, 0xffffffff};

    /*
     * insert bits at end of bitbuffer
     */
    lbitbuffer = buffer->bitbuffer;
    lbits_to_go = buffer->bits_to_go;
    if (lbits_to_go+n > 32) {
	/*
	 * special case for large n: put out the top lbits_to_go bits first
	 * note that 0 < lbits_to_go <= 8
	 */
	lbitbuffer <<= lbits_to_go;
/*	lbitbuffer |= (bits>>(n-lbits_to_go)) & ((1<<lbits_to_go)-1); */
	lbitbuffer |= (bits>>(n-lbits_to_go)) & *(mask+lbits_to_go);
	putcbuf(lbitbuffer & 0xff,buffer);
	n -= lbits_to_go;
	lbits_to_go = 8;
    }
    lbitbuffer <<= n;
/*    lbitbuffer |= ( bits & ((1<<n)-1) ); */
    lbitbuffer |= ( bits & *(mask+n) );
    lbits_to_go -= n;
    while (lbits_to_go <= 0) {
	/*
	 * bitbuffer full, put out top 8 bits
	 */
	putcbuf((lbitbuffer>>(-lbits_to_go)) & 0xff,buffer);
	lbits_to_go += 8;
    }
    buffer->bitbuffer = lbitbuffer;
    buffer->bits_to_go = lbits_to_go;
    return(0);
}